

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_expressions.cpp
# Opt level: O0

ConditionalPredicateSyntax * __thiscall
slang::parsing::Parser::parseConditionalPredicate
          (Parser *this,ExpressionSyntax *first,TokenKind endKind,Token *end)

{
  Token matchesKeyword;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> elements;
  undefined8 uVar1;
  bool bVar2;
  ConditionalPredicateSyntax *pCVar3;
  Token *in_RCX;
  Info *extraout_RDX;
  ParserBase *in_RDI;
  Token TVar4;
  Token TVar5;
  Parser *in_stack_00000098;
  Token matches;
  MatchesClauseSyntax *matchesClause;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  undefined4 in_stack_fffffffffffffdd8;
  undefined4 in_stack_fffffffffffffddc;
  SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *in_stack_fffffffffffffde0;
  undefined4 in_stack_fffffffffffffde8;
  undefined2 in_stack_fffffffffffffdec;
  TokenKind in_stack_fffffffffffffdee;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffdf0;
  ParserBase *in_stack_fffffffffffffe00;
  undefined2 local_198;
  undefined1 uStack_196;
  undefined1 uStack_195;
  undefined4 local_11c;
  SyntaxNode *local_118;
  RequireItems requireItems;
  Token *in_stack_fffffffffffffef8;
  TokenKind in_stack_ffffffffffffff04;
  TokenKind in_stack_ffffffffffffff06;
  __extent_storage<18446744073709551615UL> in_stack_ffffffffffffff08;
  ParserBase *in_stack_ffffffffffffff10;
  DiagCode in_stack_ffffffffffffff20;
  anon_class_8_1_8991fb9c *in_stack_ffffffffffffff28;
  Info *in_stack_ffffffffffffff30;
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_98 [2];
  Token *local_20;
  Info *src;
  
  local_20 = in_RCX;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8ab707);
  bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffdf0._M_extent_value,
                           in_stack_fffffffffffffdee);
  uVar1 = _local_198;
  TVar5.info = in_stack_ffffffffffffff30;
  uStack_196 = (undefined1)((ulong)_local_198 >> 0x10);
  uStack_195 = (undefined1)((ulong)uVar1 >> 0x18);
  TVar5.kind = local_198;
  TVar5._2_1_ = uStack_196;
  TVar5.numFlags.raw = uStack_195;
  TVar5.rawLen = (int)((ulong)uVar1 >> 0x20);
  if (bVar2) {
    TVar5 = ParserBase::consume(in_stack_fffffffffffffe00);
    in_stack_ffffffffffffff28 = TVar5._0_8_;
    parsePattern(in_stack_00000098);
    matchesKeyword.rawLen._0_2_ = in_stack_fffffffffffffdec;
    matchesKeyword.kind = (short)in_stack_fffffffffffffde8;
    matchesKeyword._2_1_ = (char)((uint)in_stack_fffffffffffffde8 >> 0x10);
    matchesKeyword.numFlags.raw = (char)((uint)in_stack_fffffffffffffde8 >> 0x18);
    matchesKeyword.rawLen._2_2_ = in_stack_fffffffffffffdee;
    matchesKeyword.info = (Info *)in_stack_fffffffffffffdf0._M_extent_value;
    slang::syntax::SyntaxFactory::matchesClause
              ((SyntaxFactory *)in_stack_fffffffffffffde0,matchesKeyword,
               (PatternSyntax *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  }
  slang::syntax::SyntaxFactory::conditionalPattern
            ((SyntaxFactory *)in_stack_fffffffffffffde0,
             (ExpressionSyntax *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8),
             (MatchesClauseSyntax *)0x8ab834);
  slang::syntax::TokenOrSyntax::TokenOrSyntax
            ((TokenOrSyntax *)in_stack_fffffffffffffde0,
             (SyntaxNode *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
            ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffde0,
             (TokenOrSyntax *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  bVar2 = ParserBase::peek((ParserBase *)in_stack_fffffffffffffdf0._M_extent_value,
                           in_stack_fffffffffffffdee);
  if (bVar2) {
    TVar4 = ParserBase::consume(in_stack_fffffffffffffe00);
    requireItems = TVar4.info._4_4_;
    local_118 = TVar4._0_8_;
    TVar4.rawLen._0_2_ = in_stack_fffffffffffffdec;
    TVar4.kind = (short)in_stack_fffffffffffffde8;
    TVar4._2_1_ = (char)((uint)in_stack_fffffffffffffde8 >> 0x10);
    TVar4.numFlags.raw = (char)((uint)in_stack_fffffffffffffde8 >> 0x18);
    TVar4.rawLen._2_2_ = in_stack_fffffffffffffdee;
    TVar4.info = (Info *)in_stack_fffffffffffffdf0._M_extent_value;
    slang::syntax::TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_stack_fffffffffffffde0,TVar4);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              ((SmallVectorBase<slang::syntax::TokenOrSyntax> *)in_stack_fffffffffffffde0,
               (TokenOrSyntax *)CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    local_11c = 0x340005;
    in_stack_fffffffffffffde0 =
         (SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)&stack0xfffffffffffffed8;
    in_stack_fffffffffffffdd8 = 0x340005;
    in_stack_fffffffffffffde8 = 0;
    ParserBase::
    parseList<&slang::syntax::SyntaxFacts::isPossibleExpressionOrTripleAnd,&slang::syntax::SyntaxFacts::isEndOfConditionalPredicate,slang::parsing::Parser::parseConditionalPredicate(slang::syntax::ExpressionSyntax&,slang::parsing::TokenKind,slang::parsing::Token&)::__0>
              (in_stack_ffffffffffffff10,
               (SmallVectorBase<slang::syntax::TokenOrSyntax> *)
               in_stack_ffffffffffffff08._M_extent_value,in_stack_ffffffffffffff06,
               in_stack_ffffffffffffff04,in_stack_fffffffffffffef8,requireItems,
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff28,(AllowEmpty)TVar5.info);
    src = extraout_RDX;
  }
  else {
    TVar5 = ParserBase::expect(in_RDI,TVar5.rawLen._2_2_);
    src = TVar5.info;
    *local_20 = TVar5;
  }
  SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
            (local_98,(EVP_PKEY_CTX *)in_RDI->alloc,(EVP_PKEY_CTX *)src);
  elements._M_ptr._4_2_ = in_stack_fffffffffffffdec;
  elements._M_ptr._0_4_ = in_stack_fffffffffffffde8;
  elements._M_ptr._6_2_ = in_stack_fffffffffffffdee;
  elements._M_extent._M_extent_value = in_stack_fffffffffffffdf0._M_extent_value;
  slang::syntax::SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax>::SeparatedSyntaxList
            (in_stack_fffffffffffffde0,elements);
  pCVar3 = slang::syntax::SyntaxFactory::conditionalPredicate
                     ((SyntaxFactory *)in_stack_fffffffffffffde0,
                      (SeparatedSyntaxList<slang::syntax::ConditionalPatternSyntax> *)
                      CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x8aba46);
  return pCVar3;
}

Assistant:

ConditionalPredicateSyntax& Parser::parseConditionalPredicate(ExpressionSyntax& first,
                                                              TokenKind endKind, Token& end) {
    SmallVector<TokenOrSyntax, 4> buffer;

    MatchesClauseSyntax* matchesClause = nullptr;
    if (peek(TokenKind::MatchesKeyword)) {
        auto matches = consume();
        matchesClause = &factory.matchesClause(matches, parsePattern());
    }

    buffer.push_back(&factory.conditionalPattern(first, matchesClause));

    if (peek(TokenKind::TripleAnd)) {
        buffer.push_back(consume());
        parseList<isPossibleExpressionOrTripleAnd, isEndOfConditionalPredicate>(
            buffer, endKind, TokenKind::TripleAnd, end, RequireItems::True,
            diag::ExpectedConditionalPattern, [this] { return &parseConditionalPattern(); });
    }
    else {
        end = expect(endKind);
    }

    return factory.conditionalPredicate(buffer.copy(alloc));
}